

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O1

void av1_inv_txfm2d_add_32x64_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  int32_t mod_input [2048];
  int txfm_buf [2176];
  int32_t local_4240 [32];
  undefined8 local_41c0 [1008];
  int32_t local_2240 [2188];
  
  lVar3 = 0;
  do {
    lVar1 = lVar3 * 2;
    puVar4 = (undefined4 *)((long)input + lVar3);
    puVar5 = (undefined4 *)((long)local_4240 + lVar1);
    for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + 1;
      puVar5 = puVar5 + 1;
    }
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x70) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x78) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x60) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x68) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x50) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x58) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x40) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x48) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x30) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x38) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x20) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x28) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x10) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 0x18) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1) = 0;
    *(undefined8 *)((long)local_41c0 + lVar1 + 8) = 0;
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x1000);
  inv_txfm2d_add_facade(local_4240,output,stride,local_2240,tx_type,'\v',bd);
  return;
}

Assistant:

void av1_inv_txfm2d_add_32x64_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // Remap 32x32 input into a modified 32x64 input by:
  // - Copying over these values in top-left 32x32 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[64 * 32];
  for (int col = 0; col < 32; ++col) {
    memcpy(mod_input + col * 64, input + col * 32, 32 * sizeof(*mod_input));
    memset(mod_input + col * 64 + 32, 0, 32 * sizeof(*mod_input));
  }
  DECLARE_ALIGNED(32, int, txfm_buf[64 * 32 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_32X64,
                        bd);
}